

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

double __thiscall
chrono::ChFunction::Compute_int
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double local_38;
  
  dVar1 = xmin;
  (*this->_vptr_ChFunction[10])();
  auVar4 = ZEXT816(0) << 0x40;
  local_38 = xmin;
  while( true ) {
    local_38 = local_38 + sampling_step;
    if (xmax < local_38) break;
    dVar2 = local_38;
    (*this->_vptr_ChFunction[10])(this,derivate);
    auVar4._8_8_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (dVar2 + dVar1) * sampling_step;
    auVar4 = vfmadd231sd_fma(auVar4,auVar3,ZEXT816(0x3fe0000000000000));
    dVar1 = dVar2;
  }
  return auVar4._0_8_;
}

Assistant:

double ChFunction::Compute_int(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    double ya = this->Get_y_dN(xmin, derivate);
    double yb = 0;
    for (double mx = xmin + sampling_step; mx <= xmax; mx += sampling_step) {
        yb = this->Get_y_dN(mx, derivate);
        mret += sampling_step * (ya + yb) * 0.5;  // trapezoidal quadrature
        ya = yb;
    }
    return mret;
}